

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<char[13],int,int,int,char[42]>
               (ostream *out,char *fmt,char (*args) [13],int *args_1,int *args_2,int *args_3,
               char (*args_4) [42])

{
  long in_FS_OFFSET;
  FormatList local_90;
  FormatArg local_80;
  int *local_68;
  code *local_60;
  code *local_58;
  int *local_50;
  code *local_48;
  code *local_40;
  int *local_38;
  code *local_30;
  code *local_28;
  char (*local_20) [42];
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.m_args = &local_80;
  local_90.m_N = 5;
  local_80.m_formatImpl = detail::FormatArg::formatImpl<char[13]>;
  local_80.m_toIntImpl = detail::FormatArg::toIntImpl<char[13]>;
  local_60 = detail::FormatArg::formatImpl<int>;
  local_58 = detail::FormatArg::toIntImpl<int>;
  local_48 = detail::FormatArg::formatImpl<int>;
  local_40 = detail::FormatArg::toIntImpl<int>;
  local_30 = detail::FormatArg::formatImpl<int>;
  local_28 = detail::FormatArg::toIntImpl<int>;
  local_20 = args_4;
  local_18 = detail::FormatArg::formatImpl<char[42]>;
  local_10 = detail::FormatArg::toIntImpl<char[42]>;
  local_80.m_value = args;
  local_68 = args_1;
  local_50 = args_2;
  local_38 = args_3;
  vformat(out,fmt,&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}